

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_helper.cxx
# Opt level: O0

void __thiscall
batch_helper::make_target_name(batch_helper *this,string *target,char *source,char *extension)

{
  ulong uVar1;
  string *local_98;
  undefined1 local_68 [8];
  string folder;
  string name;
  char *extension_local;
  char *source_local;
  string *target_local;
  batch_helper *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator=((string *)target,(string *)&this->m_output_file);
  }
  else {
    std::__cxx11::string::string((string *)(folder.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_68);
    xray_re::xr_file_system::split_path
              (source,(string *)local_68,(string *)(folder.field_2._M_local_buf + 8),(string *)0x0);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      local_98 = (string *)&this->m_output_folder;
    }
    else {
      local_98 = (string *)local_68;
    }
    std::__cxx11::string::operator=((string *)target,local_98);
    std::__cxx11::string::operator+=((string *)target,(string *)(folder.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)target,extension);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(folder.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void batch_helper::make_target_name(std::string& target, const char* source, const char* extension) const
{
	if (m_output_file.empty()) {
		std::string name, folder;
		xr_file_system::split_path(source, &folder, &name);
		target = m_output_folder.empty() ? folder : m_output_folder;
		target += name;
		target += extension;
	} else {
		target = m_output_file;
	}
}